

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

int Abc_NtkCountInst_rec(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int i;
  
  iVar3 = pNtk->iStep;
  if (iVar3 < 0) {
    p = Abc_NtkDfsBoxes(pNtk);
    i = 0;
    iVar4 = p->nSize;
    if (p->nSize < 1) {
      iVar4 = 0;
    }
    iVar3 = 0;
    for (; iVar4 != i; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p,i);
      if (((*(uint *)((long)pvVar2 + 0x14) & 0xe) == 8 ||
           (*(uint *)((long)pvVar2 + 0x14) & 0xf) == 10) &&
         (*(Abc_Ntk_t **)((long)pvVar2 + 0x38) != pNtk)) {
        iVar1 = Abc_NtkCountInst_rec(*(Abc_Ntk_t **)((long)pvVar2 + 0x38));
        iVar3 = iVar3 + iVar1;
      }
    }
    Vec_PtrFree(p);
    iVar3 = iVar3 + 1;
    pNtk->iStep = iVar3;
  }
  return iVar3;
}

Assistant:

int Abc_NtkCountInst_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    if ( pNtk->iStep >= 0 )
        return pNtk->iStep;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountInst_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->iStep = 1 + Counter;
}